

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.cpp
# Opt level: O3

void __thiscall merlin::bte::forward(bte *this)

{
  _Rb_tree_header *p_Var1;
  pointer pmVar2;
  findex a;
  pointer puVar3;
  long lVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  findex *pfVar11;
  char *pcVar12;
  ulong *puVar13;
  pointer pdVar14;
  double dVar15;
  value s;
  double dVar16;
  factor bel;
  factor F_1;
  factor F;
  variable VX;
  factor local_1b0;
  factor local_150;
  factor local_f0;
  factor local_90;
  
  if (this->m_debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Begin forward (top-down) pass ...",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  this->m_logz = 0.0;
  gettimeofday((timeval *)&local_f0,(__timezone_ptr_t)0x0);
  puVar13 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (puVar13 !=
      (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (this->m_debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," - Eliminating var ",0x13);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        uVar8 = *puVar13;
        uVar9 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar9 = uVar8;
        }
        pcVar12 = " (MAP)\n";
        if (((this->m_var_types).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar9 >> 6) +
              (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar8 & 0x3f) & 1) == 0) {
          pcVar12 = " (SUM)\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar12,7);
      }
      local_90._vptr_factor = (_func_int **)*puVar13;
      dVar15 = (this->super_graphical_model).m_dims.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)local_90._vptr_factor];
      uVar8 = (ulong)dVar15;
      local_90.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
      uVar8 = *puVar13;
      pmVar2 = (this->m_out).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      a = **(findex **)
            &(this->m_clusters).
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar8].super_my_vector<unsigned_long>.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      puVar3 = *(pointer *)
                &pmVar2[a].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (*(pointer *)
           ((long)&pmVar2[a].super_my_vector<unsigned_long>.
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) != puVar3)
      {
        lVar4 = *(long *)(*(long *)&(this->m_edge_indeces).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[a].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data + *puVar3 * 8);
        uVar9 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar9 = uVar8;
        }
        uVar9 = (this->m_var_types).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar9 >> 6) +
                 (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff];
        if ((uVar9 >> (uVar8 & 0x3f) & 1) == 0) {
          incoming(&local_1b0,this,a,uVar9);
          variable_set::variable_set((variable_set *)&local_150,(variable *)&local_90);
          factor::sum(&local_f0,&local_1b0,(variable_set *)&local_150);
          factor::operator=((this->m_forward).
                            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar4,&local_f0);
        }
        else {
          incoming(&local_1b0,this,a,uVar9);
          variable_set::variable_set((variable_set *)&local_150,(variable *)&local_90);
          factor::max(&local_f0,&local_1b0,(variable_set *)&local_150);
          factor::operator=((this->m_forward).
                            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar4,&local_f0);
        }
        factor::~factor(&local_f0);
        variable_set::~variable_set((variable_set *)&local_150);
        factor::~factor(&local_1b0);
        if (this->m_debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  forward msg (",0xf);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): elim = ",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
          poVar5 = operator<<((ostream *)&std::cout,
                              (this->m_forward).
                              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 !=
             (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  factor::factor(&local_f0,0.0);
  pfVar11 = (this->m_roots).super_my_vector<unsigned_long>.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar11 !=
      (this->m_roots).super_my_vector<unsigned_long>.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var1 = &(this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header;
    do {
      calc_belief(&local_1b0,this,*pfVar11);
      p_Var10 = (this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_0012c7dc:
        __assert_fail("mi != m_cluster2var.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/bte.cpp"
                      ,0x2df,"void merlin::bte::forward()");
      }
      uVar8 = *pfVar11;
      p_Var6 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var10 + 1) >= uVar8) {
          p_Var6 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar8];
      } while (p_Var10 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
         (uVar8 < ((_Rb_tree_header *)p_Var6)->_M_node_count)) goto LAB_0012c7dc;
      uVar8 = *(ulong *)((long)p_Var6 + 0x28);
      uVar9 = uVar8 + 0x3f;
      if (-1 < (long)uVar8) {
        uVar9 = uVar8;
      }
      if (((this->m_var_types).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) +
            (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar8 & 0x3f) & 1) == 0) {
        s = 0.0;
        for (pdVar7 = local_1b0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar7 != local_1b0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
          s = s + *pdVar7;
        }
        factor::factor(&local_90,s);
        factor::factor(&local_150,&local_90);
        pdVar7 = local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar14 = local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar14 != pdVar7; pdVar14 = pdVar14 + 1) {
          dVar15 = log(*pdVar14);
          *pdVar14 = dVar15;
        }
        factor::binaryOpIP<merlin::factor::binOpPlus>(&local_f0,&local_150);
      }
      else {
        dVar15 = -INFINITY;
        if (local_1b0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_1b0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pdVar7 = local_1b0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar16 = -INFINITY;
          do {
            dVar15 = *pdVar7;
            if (*pdVar7 <= dVar16) {
              dVar15 = dVar16;
            }
            pdVar7 = pdVar7 + 1;
            dVar16 = dVar15;
          } while (pdVar7 != local_1b0.t_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        }
        factor::factor(&local_90,dVar15);
        factor::factor(&local_150,&local_90);
        pdVar7 = local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar14 = local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar14 != pdVar7; pdVar14 = pdVar14 + 1) {
          dVar15 = log(*pdVar14);
          *pdVar14 = dVar15;
        }
        factor::binaryOpIP<merlin::factor::binOpPlus>(&local_f0,&local_150);
      }
      factor::~factor(&local_150);
      factor::~factor(&local_90);
      factor::~factor(&local_1b0);
      pfVar11 = pfVar11 + 1;
    } while (pfVar11 !=
             (this->m_roots).super_my_vector<unsigned_long>.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    dVar15 = -INFINITY;
  }
  else {
    dVar16 = -INFINITY;
    do {
      dVar15 = *local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start <= dVar16) {
        dVar15 = dVar16;
      }
      local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      dVar16 = dVar15;
    } while (local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this->m_logz = dVar15 + this->m_logz;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[BTE] Finished forward pass in ",0x1f);
  gettimeofday((timeval *)&local_1b0,(__timezone_ptr_t)0x0);
  poVar5 = std::ostream::_M_insert<double>
                     (((double)(long)local_1b0.v_.m_v.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start / 1000000.0 +
                      (double)(long)local_1b0._vptr_factor) -
                      ((double)(long)local_f0.v_.m_v.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start / 1000000.0 +
                      (double)(long)local_f0._vptr_factor));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  factor::~factor(&local_f0);
  return;
}

Assistant:

void bte::forward() {

	if (m_debug) {
		std::cout << "Begin forward (top-down) pass ..." << std::endl;
	}

	m_logz = 0; // reset the log parition function
	double timestamp = timeSystem();
	for (variable_order_t::const_iterator x = m_order.begin(); x != m_order.end(); ++x) {

		if (m_debug) {
			std::cout << " - Eliminating var " << *x
					<< (m_var_types[*x] ? " (MAP)\n" : " (SUM)\n");
		}

		// Generate forward messages
		variable VX = var(*x);
		findex a = m_clusters[*x][0]; // get source bucket of the variable
		if (m_out[a].size() > 0) {
			findex b = *(m_out[a].begin()); // destination bucket
			size_t ei = m_edge_indeces[a][b]; // edge index (for message)
			if (m_var_types[*x] == false) { // SUM variable
				m_forward[ei] = incoming(a, ei).sum(VX);
			} else { // MAP variable
				m_forward[ei] = incoming(a, ei).max(VX);
			}

			if (m_debug) {
				std::cout << "  forward msg (" << a << "," << b << "): elim = " << VX << " -> ";
				std::cout << m_forward[ei] << std::endl;
			}
		}
	} // done

	// Compute log partition function logZ or MAP/MMAP value
	factor F(0.0);
	for (flist::const_iterator ci = m_roots.begin();
			ci != m_roots.end(); ++ci) {

		factor bel = calc_belief(*ci);
		std::map<size_t, size_t>::iterator mi = m_cluster2var.find(*ci);
		assert(mi != m_cluster2var.end());
		size_t v = mi->second;
		if (m_var_types[v] == false) { // SUM variable
			F += log( bel.sum());
		} else { // MAP variable
			F += log( bel.max() );
		}
	}

	// Partition function or MAP/MMAP value
	m_logz += F.max();

	std::cout << "[BTE] Finished forward pass in " << (timeSystem() - timestamp)
			<< " seconds" << std::endl;
}